

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SwapOneofField
          (Reflection *this,Message *message1,Message *message2,OneofDescriptor *oneof_descriptor)

{
  bool bVar1;
  int key;
  OneofDescriptor *pOVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  uint32 uVar6;
  ulong uVar7;
  FieldDescriptor *field;
  double *pdVar8;
  unsigned_long *puVar9;
  uint *puVar10;
  float *pfVar11;
  bool *pbVar12;
  LogMessage *pLVar13;
  FieldDescriptor *field_00;
  Message *sub_message;
  unsigned_long uVar14;
  long *plVar15;
  string temp_string;
  undefined1 local_119;
  Message *local_118;
  FieldDescriptor *local_110;
  double local_108;
  uint local_fc;
  float local_f8;
  uint local_f4;
  uint local_f0;
  int local_ec;
  FieldDescriptor *local_e8;
  undefined1 local_e0 [56];
  double local_a8;
  unsigned_long local_a0;
  unsigned_long local_98;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  uVar7 = (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                     *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >> 4) *
                        -0x55555554 + (this->schema_).oneof_case_offset_);
  local_ec = *(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite + uVar7);
  key = *(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar7);
  local_90 = local_80;
  local_88 = 0;
  local_80[0] = 0;
  if (local_ec == 0) {
    field = (FieldDescriptor *)0x0;
    local_118 = (Message *)0x0;
    goto LAB_00358eaf;
  }
  field = Descriptor::FindFieldByNumber(this->descriptor_,local_ec);
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_e0._0_8_ = FieldDescriptor::TypeOnceInit;
    local_110 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_e0,&local_110)
    ;
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
  case 1:
    puVar10 = (uint *)GetRaw<int>(this,message1,field);
    local_f0 = *puVar10;
    local_118 = (Message *)0x0;
    break;
  case 2:
    puVar9 = (unsigned_long *)GetRaw<long>(this,message1,field);
    local_98 = *puVar9;
    local_118 = (Message *)0x0;
    break;
  case 3:
    puVar10 = GetRaw<unsigned_int>(this,message1,field);
    local_f4 = *puVar10;
    local_118 = (Message *)0x0;
    break;
  case 4:
    puVar9 = GetRaw<unsigned_long>(this,message1,field);
    local_a0 = *puVar9;
    local_118 = (Message *)0x0;
    break;
  case 5:
    pdVar8 = GetRaw<double>(this,message1,field);
    local_a8 = *pdVar8;
    goto LAB_00358db1;
  case 6:
    pfVar11 = GetRaw<float>(this,message1,field);
    local_f8 = *pfVar11;
LAB_00358db1:
    local_118 = (Message *)0x0;
    break;
  case 7:
    pbVar12 = GetRaw<bool>(this,message1,field);
    local_119 = *pbVar12;
    local_118 = (Message *)0x0;
    break;
  case 8:
    puVar10 = (uint *)GetRaw<int>(this,message1,field);
    local_fc = *puVar10;
    local_118 = (Message *)0x0;
    break;
  case 9:
    GetString_abi_cxx11_((string *)local_e0,this,message1,field);
    std::__cxx11::string::operator=((string *)&local_90,(string *)local_e0);
    if ((undefined1 *)local_e0._0_8_ != local_e0 + 0x10) {
      operator_delete((void *)local_e0._0_8_);
    }
    goto LAB_00358ea6;
  case 10:
    local_118 = ReleaseMessage(this,message1,field,(MessageFactory *)0x0);
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_e0,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x212);
    pLVar13 = internal::LogMessage::operator<<((LogMessage *)local_e0,"Unimplemented type: ");
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_110 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
      local_e8 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_110,
                 &local_e8);
    }
    pLVar13 = internal::LogMessage::operator<<
                        (pLVar13,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                         (ulong)*(uint *)(field + 0x38) * 4));
    internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar13);
    internal::LogMessage::~LogMessage((LogMessage *)local_e0);
LAB_00358ea6:
    local_118 = (Message *)0x0;
  }
LAB_00358eaf:
  if (key == 0) {
    ClearOneof(this,message1,oneof_descriptor);
    goto LAB_003593cc;
  }
  field_00 = Descriptor::FindFieldByNumber(this->descriptor_,key);
  if (*(once_flag **)(field_00 + 0x30) != (once_flag *)0x0) {
    local_e0._0_8_ = FieldDescriptor::TypeOnceInit;
    local_110 = field_00;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field_00 + 0x30),(_func_void_FieldDescriptor_ptr **)local_e0,
               &local_110);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field_00 + 0x38) * 4)
        ) {
  case 1:
    puVar10 = (uint *)GetRaw<int>(this,message2,field_00);
    pOVar2 = *(OneofDescriptor **)(field_00 + 0x58);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x30)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field_00 + 0x44))) {
      ClearOneof(this,message1,pOVar2);
    }
    uVar4 = *puVar10;
    uVar5 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field_00);
    goto LAB_00359130;
  case 2:
    puVar9 = (unsigned_long *)GetRaw<long>(this,message2,field_00);
    pOVar2 = *(OneofDescriptor **)(field_00 + 0x58);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x30)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field_00 + 0x44))) {
      ClearOneof(this,message1,pOVar2);
    }
    uVar14 = *puVar9;
    uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field_00);
    goto LAB_00359195;
  case 3:
    puVar10 = GetRaw<unsigned_int>(this,message2,field_00);
    pOVar2 = *(OneofDescriptor **)(field_00 + 0x58);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x30)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field_00 + 0x44))) {
      ClearOneof(this,message1,pOVar2);
    }
    uVar4 = *puVar10;
    uVar5 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field_00);
    goto LAB_00359130;
  case 4:
    puVar9 = GetRaw<unsigned_long>(this,message2,field_00);
    pOVar2 = *(OneofDescriptor **)(field_00 + 0x58);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x30)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field_00 + 0x44))) {
      ClearOneof(this,message1,pOVar2);
    }
    uVar14 = *puVar9;
    uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field_00);
LAB_00359195:
    *(unsigned_long *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar4) =
         uVar14;
    break;
  case 5:
    pdVar8 = GetRaw<double>(this,message2,field_00);
    pOVar2 = *(OneofDescriptor **)(field_00 + 0x58);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x30)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field_00 + 0x44))) {
      ClearOneof(this,message1,pOVar2);
    }
    local_108 = *pdVar8;
    uVar6 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field_00);
    *(double *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar6) = local_108;
    break;
  case 6:
    pfVar11 = GetRaw<float>(this,message2,field_00);
    pOVar2 = *(OneofDescriptor **)(field_00 + 0x58);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x30)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field_00 + 0x44))) {
      ClearOneof(this,message1,pOVar2);
    }
    local_108 = (double)CONCAT44(local_108._4_4_,*pfVar11);
    uVar6 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field_00);
    *(undefined4 *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar6) =
         local_108._0_4_;
    break;
  case 7:
    pbVar12 = GetRaw<bool>(this,message2,field_00);
    pOVar2 = *(OneofDescriptor **)(field_00 + 0x58);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x30)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field_00 + 0x44))) {
      ClearOneof(this,message1,pOVar2);
    }
    bVar1 = *pbVar12;
    uVar6 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field_00);
    *(bool *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar6) = bVar1;
    break;
  case 8:
    puVar10 = (uint *)GetRaw<int>(this,message2,field_00);
    pOVar2 = *(OneofDescriptor **)(field_00 + 0x58);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x30)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field_00 + 0x44))) {
      ClearOneof(this,message1,pOVar2);
    }
    uVar4 = *puVar10;
    uVar5 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field_00);
LAB_00359130:
    *(uint *)((long)&(message1->super_MessageLite)._vptr_MessageLite + (ulong)uVar5) = uVar4;
    break;
  case 9:
    GetString_abi_cxx11_(&local_50,this,message2,field_00);
    SetString(this,message1,field_00,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    goto LAB_003593cc;
  case 10:
    sub_message = ReleaseMessage(this,message2,field_00,(MessageFactory *)0x0);
    SetAllocatedMessage(this,message1,sub_message,field_00);
    goto LAB_003593cc;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_e0,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x231);
    pLVar13 = internal::LogMessage::operator<<((LogMessage *)local_e0,"Unimplemented type: ");
    if (*(once_flag **)(field_00 + 0x30) != (once_flag *)0x0) {
      local_110 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
      local_e8 = field_00;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field_00 + 0x30),(_func_void_FieldDescriptor_ptr **)&local_110,
                 &local_e8);
    }
    pLVar13 = internal::LogMessage::operator<<
                        (pLVar13,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                         (ulong)*(uint *)(field_00 + 0x38) * 4));
    internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar13);
    internal::LogMessage::~LogMessage((LogMessage *)local_e0);
    goto LAB_003593cc;
  }
  lVar3 = *(long *)(field_00 + 0x58);
  if (lVar3 == 0) {
    uVar7 = (ulong)(uint)(this->schema_).has_bits_offset_;
    if (uVar7 != 0xffffffff) {
      if (field_00[0x42] == (FieldDescriptor)0x0) {
        plVar15 = (long *)(*(long *)(field_00 + 0x50) + 0x28);
      }
      else if (*(long *)(field_00 + 0x60) == 0) {
        plVar15 = (long *)(*(long *)(field_00 + 0x28) + 0x80);
      }
      else {
        plVar15 = (long *)(*(long *)(field_00 + 0x60) + 0x50);
      }
      uVar4 = (this->schema_).has_bit_indices_
              [(int)((ulong)((long)field_00 - *plVar15) >> 3) * 0x286bca1b];
      puVar10 = (uint *)((long)&(message1->super_MessageLite)._vptr_MessageLite +
                        (ulong)(uVar4 >> 5) * 4 + uVar7);
      *puVar10 = *puVar10 | 1 << ((byte)uVar4 & 0x1f);
    }
  }
  else {
    *(undefined4 *)
     ((long)&(message1->super_MessageLite)._vptr_MessageLite +
     (ulong)(uint)((int)((ulong)(lVar3 - *(long *)(*(long *)(lVar3 + 0x10) + 0x30)) >> 4) *
                   -0x55555554 + (this->schema_).oneof_case_offset_)) =
         *(undefined4 *)(field_00 + 0x44);
  }
LAB_003593cc:
  if (local_ec == 0) {
    ClearOneof(this,message2,oneof_descriptor);
    goto LAB_00359896;
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_e0._0_8_ = FieldDescriptor::TypeOnceInit;
    local_110 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)local_e0,&local_110)
    ;
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4)) {
  case 1:
    pOVar2 = *(OneofDescriptor **)(field + 0x58);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x30)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 0x44))) {
      ClearOneof(this,message2,pOVar2);
    }
    uVar6 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar7 = (ulong)uVar6;
    uVar4 = local_f0;
    goto LAB_0035960a;
  case 2:
    pOVar2 = *(OneofDescriptor **)(field + 0x58);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x30)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 0x44))) {
      ClearOneof(this,message2,pOVar2);
    }
    uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar14 = local_98;
    goto LAB_00359667;
  case 3:
    pOVar2 = *(OneofDescriptor **)(field + 0x58);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x30)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 0x44))) {
      ClearOneof(this,message2,pOVar2);
    }
    uVar6 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar7 = (ulong)uVar6;
    uVar4 = local_f4;
    goto LAB_0035960a;
  case 4:
    pOVar2 = *(OneofDescriptor **)(field + 0x58);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x30)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 0x44))) {
      ClearOneof(this,message2,pOVar2);
    }
    uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar14 = local_a0;
LAB_00359667:
    *(unsigned_long *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar4) =
         uVar14;
    break;
  case 5:
    pOVar2 = *(OneofDescriptor **)(field + 0x58);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x30)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 0x44))) {
      ClearOneof(this,message2,pOVar2);
    }
    uVar6 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(double *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar6) = local_a8;
    break;
  case 6:
    pOVar2 = *(OneofDescriptor **)(field + 0x58);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x30)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 0x44))) {
      ClearOneof(this,message2,pOVar2);
    }
    uVar6 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(float *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar6) = local_f8;
    break;
  case 7:
    pOVar2 = *(OneofDescriptor **)(field + 0x58);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x30)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 0x44))) {
      ClearOneof(this,message2,pOVar2);
    }
    uVar6 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(undefined1 *)((long)&(message2->super_MessageLite)._vptr_MessageLite + (ulong)uVar6) =
         local_119;
    break;
  case 8:
    pOVar2 = *(OneofDescriptor **)(field + 0x58);
    if ((pOVar2 != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)pOVar2 -
                                           *(long *)(*(long *)(pOVar2 + 0x10) + 0x30)) >> 4) *
                              -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 0x44))) {
      ClearOneof(this,message2,pOVar2);
    }
    uVar6 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    uVar7 = (ulong)uVar6;
    uVar4 = local_fc;
LAB_0035960a:
    *(uint *)((long)&(message2->super_MessageLite)._vptr_MessageLite + uVar7) = uVar4;
    break;
  case 9:
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_90,local_90 + local_88);
    SetString(this,message2,field,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    goto LAB_00359896;
  case 10:
    SetAllocatedMessage(this,message2,local_118,field);
    goto LAB_00359896;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_e0,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x251);
    pLVar13 = internal::LogMessage::operator<<((LogMessage *)local_e0,"Unimplemented type: ");
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_110 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
      local_e8 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&local_110,
                 &local_e8);
    }
    pLVar13 = internal::LogMessage::operator<<
                        (pLVar13,*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                                         (ulong)*(uint *)(field + 0x38) * 4));
    internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar13);
    internal::LogMessage::~LogMessage((LogMessage *)local_e0);
    goto LAB_00359896;
  }
  lVar3 = *(long *)(field + 0x58);
  if (lVar3 == 0) {
    uVar7 = (ulong)(uint)(this->schema_).has_bits_offset_;
    if (uVar7 != 0xffffffff) {
      if (field[0x42] == (FieldDescriptor)0x0) {
        plVar15 = (long *)(*(long *)(field + 0x50) + 0x28);
      }
      else if (*(long *)(field + 0x60) == 0) {
        plVar15 = (long *)(*(long *)(field + 0x28) + 0x80);
      }
      else {
        plVar15 = (long *)(*(long *)(field + 0x60) + 0x50);
      }
      uVar4 = (this->schema_).has_bit_indices_
              [(int)((ulong)((long)field - *plVar15) >> 3) * 0x286bca1b];
      puVar10 = (uint *)((long)&(message2->super_MessageLite)._vptr_MessageLite +
                        (ulong)(uVar4 >> 5) * 4 + uVar7);
      *puVar10 = *puVar10 | 1 << ((byte)uVar4 & 0x1f);
    }
  }
  else {
    *(undefined4 *)
     ((long)&(message2->super_MessageLite)._vptr_MessageLite +
     (ulong)(uint)((int)((ulong)(lVar3 - *(long *)(*(long *)(lVar3 + 0x10) + 0x30)) >> 4) *
                   -0x55555554 + (this->schema_).oneof_case_offset_)) =
         *(undefined4 *)(field + 0x44);
  }
LAB_00359896:
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  return;
}

Assistant:

void Reflection::SwapOneofField(Message* message1, Message* message2,
                                const OneofDescriptor* oneof_descriptor) const {
  uint32 oneof_case1 = GetOneofCase(*message1, oneof_descriptor);
  uint32 oneof_case2 = GetOneofCase(*message2, oneof_descriptor);

  int32 temp_int32;
  int64 temp_int64;
  uint32 temp_uint32;
  uint64 temp_uint64;
  float temp_float;
  double temp_double;
  bool temp_bool;
  int temp_int;
  Message* temp_message = nullptr;
  std::string temp_string;

  // Stores message1's oneof field to a temp variable.
  const FieldDescriptor* field1 = nullptr;
  if (oneof_case1 > 0) {
    field1 = descriptor_->FindFieldByNumber(oneof_case1);
    // oneof_descriptor->field(oneof_case1);
    switch (field1->cpp_type()) {
#define GET_TEMP_VALUE(CPPTYPE, TYPE)                \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:           \
    temp_##TYPE = GetField<TYPE>(*message1, field1); \
    break;

      GET_TEMP_VALUE(INT32, int32);
      GET_TEMP_VALUE(INT64, int64);
      GET_TEMP_VALUE(UINT32, uint32);
      GET_TEMP_VALUE(UINT64, uint64);
      GET_TEMP_VALUE(FLOAT, float);
      GET_TEMP_VALUE(DOUBLE, double);
      GET_TEMP_VALUE(BOOL, bool);
      GET_TEMP_VALUE(ENUM, int);
#undef GET_TEMP_VALUE
      case FieldDescriptor::CPPTYPE_MESSAGE:
        temp_message = ReleaseMessage(message1, field1);
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        temp_string = GetString(*message1, field1);
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field1->cpp_type();
    }
  }

  // Sets message1's oneof field from the message2's oneof field.
  if (oneof_case2 > 0) {
    const FieldDescriptor* field2 = descriptor_->FindFieldByNumber(oneof_case2);
    switch (field2->cpp_type()) {
#define SET_ONEOF_VALUE1(CPPTYPE, TYPE)                                  \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                               \
    SetField<TYPE>(message1, field2, GetField<TYPE>(*message2, field2)); \
    break;

      SET_ONEOF_VALUE1(INT32, int32);
      SET_ONEOF_VALUE1(INT64, int64);
      SET_ONEOF_VALUE1(UINT32, uint32);
      SET_ONEOF_VALUE1(UINT64, uint64);
      SET_ONEOF_VALUE1(FLOAT, float);
      SET_ONEOF_VALUE1(DOUBLE, double);
      SET_ONEOF_VALUE1(BOOL, bool);
      SET_ONEOF_VALUE1(ENUM, int);
#undef SET_ONEOF_VALUE1
      case FieldDescriptor::CPPTYPE_MESSAGE:
        SetAllocatedMessage(message1, ReleaseMessage(message2, field2), field2);
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        SetString(message1, field2, GetString(*message2, field2));
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field2->cpp_type();
    }
  } else {
    ClearOneof(message1, oneof_descriptor);
  }

  // Sets message2's oneof field from the temp variable.
  if (oneof_case1 > 0) {
    switch (field1->cpp_type()) {
#define SET_ONEOF_VALUE2(CPPTYPE, TYPE)            \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:         \
    SetField<TYPE>(message2, field1, temp_##TYPE); \
    break;

      SET_ONEOF_VALUE2(INT32, int32);
      SET_ONEOF_VALUE2(INT64, int64);
      SET_ONEOF_VALUE2(UINT32, uint32);
      SET_ONEOF_VALUE2(UINT64, uint64);
      SET_ONEOF_VALUE2(FLOAT, float);
      SET_ONEOF_VALUE2(DOUBLE, double);
      SET_ONEOF_VALUE2(BOOL, bool);
      SET_ONEOF_VALUE2(ENUM, int);
#undef SET_ONEOF_VALUE2
      case FieldDescriptor::CPPTYPE_MESSAGE:
        SetAllocatedMessage(message2, temp_message, field1);
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        SetString(message2, field1, temp_string);
        break;

      default:
        GOOGLE_LOG(FATAL) << "Unimplemented type: " << field1->cpp_type();
    }
  } else {
    ClearOneof(message2, oneof_descriptor);
  }
}